

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

bool TS_program_map_section::isFullBuff(uint8_t *buffer,int buf_size)

{
  byte bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint8_t *puVar5;
  BitStreamException *anon_var_0;
  unsigned_short section_length;
  uchar indicator;
  uchar table_id;
  undefined1 local_48 [8];
  BitStreamReader bitReader;
  uint8_t *bufEnd;
  uint8_t pointerField;
  int buf_size_local;
  uint8_t *buffer_local;
  
  bVar1 = *buffer;
  bitReader._24_8_ = buffer + buf_size;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_48);
  BitStreamReader::setBuffer
            ((BitStreamReader *)local_48,buffer + (ulong)bVar1 + 1,buffer + buf_size);
  uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,8);
  if (uVar2 == '\x02') {
    uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_48,2);
    if (uVar2 == '\x02') {
      BitStreamReader::skipBits((BitStreamReader *)local_48,2);
      uVar3 = BitStreamReader::getBits<unsigned_short>((BitStreamReader *)local_48,0xc);
      puVar5 = BitStream::getBuffer((BitStream *)local_48);
      iVar4 = BitStreamReader::getBitsCount((BitStreamReader *)local_48);
      buffer_local._7_1_ =
           puVar5 + (long)(int)(uint)uVar3 + (long)(iVar4 / 8) <= (ulong)bitReader._24_8_;
    }
    else {
      buffer_local._7_1_ = false;
    }
  }
  else {
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

bool TS_program_map_section::isFullBuff(uint8_t* buffer, const int buf_size)
{
    const uint8_t pointerField = *buffer;
    const uint8_t* bufEnd = buffer + buf_size;
    BitStreamReader bitReader{};
    try
    {
        bitReader.setBuffer(buffer + 1 + pointerField, buffer + buf_size);

        const auto table_id = bitReader.getBits<uint8_t>(8);
        if (table_id != 0x02)
            return false;

        const auto indicator = bitReader.getBits<uint8_t>(2);  // section syntax indicator and reserved '0' bit
        if (indicator != 2)
            return false;
        bitReader.skipBits(2);  // reserved

        const auto section_length = bitReader.getBits<uint16_t>(12);
        return bitReader.getBuffer() + bitReader.getBitsCount() / 8 + section_length <= bufEnd;
    }
    catch (BitStreamException&)
    {
        return false;
    }
}